

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::Decode
          (Underwater_Acoustic_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  undefined1 local_d8 [8];
  UnderwaterAcousticEmitterSystem uaes;
  undefined1 local_80 [7];
  KUINT8 i_2;
  APA apa;
  undefined1 local_68 [7];
  KUINT8 i_1;
  Shaft sft;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Underwater_Acoustic_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x20) {
    sft.m_i16OrderedRPM._1_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    sft.m_i16OrderedRPM._1_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_EmittingEntityID);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_EventID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8StateUpdateIndicator);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding1);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16PassiveParamIndex);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8PropPlantConfig);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumShafts);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumAPA);
  KDataStream::operator>>(pKVar2,&this->m_ui8NumEmitterSys);
  std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::clear
            (&this->m_vShafts);
  std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::clear(&this->m_vAPA);
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  ::clear(&this->m_vUAES);
  for (sft.m_i16OrderedRPM._0_1_ = 0; (byte)sft.m_i16OrderedRPM < this->m_ui8NumShafts;
      sft.m_i16OrderedRPM._0_1_ = (byte)sft.m_i16OrderedRPM + 1) {
    DATA_TYPE::Shaft::Shaft((Shaft *)local_68);
    DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)local_68);
    std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::push_back
              (&this->m_vShafts,(value_type *)local_68);
    DATA_TYPE::Shaft::~Shaft((Shaft *)local_68);
  }
  for (apa._15_1_ = 0; (byte)apa._15_1_ < this->m_ui8NumAPA; apa._15_1_ = apa._15_1_ + '\x01') {
    DATA_TYPE::APA::APA((APA *)local_80);
    DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)local_80);
    std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::push_back
              (&this->m_vAPA,(value_type *)local_80);
    DATA_TYPE::APA::~APA((APA *)local_80);
  }
  for (uaes.m_vUAEB.
       super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      uaes.m_vUAEB.
      super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ < this->m_ui8NumEmitterSys;
      uaes.m_vUAEB.
      super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           uaes.m_vUAEB.
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ + 1) {
    DATA_TYPE::UnderwaterAcousticEmitterSystem::UnderwaterAcousticEmitterSystem
              ((UnderwaterAcousticEmitterSystem *)local_d8);
    DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)local_d8);
    std::
    vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
    ::push_back(&this->m_vUAES,(value_type *)local_d8);
    DATA_TYPE::UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem
              ((UnderwaterAcousticEmitterSystem *)local_d8);
  }
  return;
}

Assistant:

void Underwater_Acoustic_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < UNDERWATER_ACOUSTIC_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> m_ui8StateUpdateIndicator
           >> m_ui8Padding1
           >> m_ui16PassiveParamIndex
           >> m_ui8PropPlantConfig
           >> m_ui8NumShafts
           >> m_ui8NumAPA
           >> m_ui8NumEmitterSys;

    m_vShafts.clear();
    m_vAPA.clear();
    m_vUAES.clear();

    for( KUINT8 i = 0; i < m_ui8NumShafts; ++i )
    {
        Shaft sft;
        stream >> KDIS_STREAM sft;
        m_vShafts.push_back( sft );
    }

    for( KUINT8 i = 0; i < m_ui8NumAPA; ++i )
    {
        APA apa;
        stream >> KDIS_STREAM apa;
        m_vAPA.push_back( apa );
    }

    for( KUINT8 i = 0; i < m_ui8NumEmitterSys; ++i )
    {
        UnderwaterAcousticEmitterSystem uaes;
        stream >> KDIS_STREAM uaes;
        m_vUAES.push_back( uaes );
    }
}